

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HL1MDLLoader.h
# Opt level: O0

void __thiscall
Assimp::MDL::HalfLife::HL1MDLLoader::
load_file_into_buffer<Assimp::MDL::HalfLife::SequenceHeader_HL1>
          (HL1MDLLoader *this,string *file_path,uchar **buffer)

{
  IOSystem *this_00;
  uchar **pFile;
  bool bVar1;
  int iVar2;
  DeadlyImportError *pDVar3;
  IOStream *__p;
  pointer pIVar4;
  undefined4 extraout_var;
  uchar *puVar5;
  allocator<char> local_151;
  string local_150;
  ulong local_130;
  size_t file_size;
  string local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  allocator<char> local_b9;
  string local_b8;
  unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> local_98;
  unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> file;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  uchar **local_20;
  uchar **buffer_local;
  string *file_path_local;
  HL1MDLLoader *this_local;
  
  local_20 = buffer;
  buffer_local = (uchar **)file_path;
  file_path_local = (string *)this;
  bVar1 = IOSystem::Exists(this->io_,file_path);
  pFile = buffer_local;
  if (!bVar1) {
    file._M_t.super___uniq_ptr_impl<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>._M_t.
    super__Tuple_impl<0UL,_Assimp::IOStream_*,_std::default_delete<Assimp::IOStream>_>.
    super__Head_base<0UL,_Assimp::IOStream_*,_false>._M_head_impl._3_1_ = 1;
    pDVar3 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    DefaultIOSystem::fileName(&local_80,(string *)buffer_local);
    std::operator+(&local_60,"Missing file ",&local_80);
    std::operator+(&local_40,&local_60,".");
    DeadlyImportError::DeadlyImportError(pDVar3,&local_40);
    file._M_t.super___uniq_ptr_impl<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>._M_t.
    super__Tuple_impl<0UL,_Assimp::IOStream_*,_std::default_delete<Assimp::IOStream>_>.
    super__Head_base<0UL,_Assimp::IOStream_*,_false>._M_head_impl._3_1_ = 0;
    __cxa_throw(pDVar3,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  this_00 = this->io_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"rb",&local_b9);
  __p = IOSystem::Open(this_00,(string *)pFile,&local_b8);
  std::unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>>::
  unique_ptr<std::default_delete<Assimp::IOStream>,void>
            ((unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>> *)&local_98,__p);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  pIVar4 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::get(&local_98)
  ;
  if (pIVar4 == (pointer)0x0) {
    file_size._7_1_ = 1;
    pDVar3 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    DefaultIOSystem::fileName(&local_120,(string *)buffer_local);
    std::operator+(&local_100,"Failed to open MDL file ",&local_120);
    std::operator+(&local_e0,&local_100,".");
    DeadlyImportError::DeadlyImportError(pDVar3,&local_e0);
    file_size._7_1_ = 0;
    __cxa_throw(pDVar3,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  pIVar4 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::operator->
                     (&local_98);
  iVar2 = (*pIVar4->_vptr_IOStream[6])();
  local_130 = CONCAT44(extraout_var,iVar2);
  if (local_130 < 0x4c) {
    pDVar3 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_150,"MDL file is too small.",&local_151);
    DeadlyImportError::DeadlyImportError(pDVar3,&local_150);
    __cxa_throw(pDVar3,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  puVar5 = (uchar *)operator_new__(local_130 + 1);
  *local_20 = puVar5;
  pIVar4 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::operator->
                     (&local_98);
  (*pIVar4->_vptr_IOStream[2])(pIVar4,*local_20,1,local_130);
  (*local_20)[local_130] = '\0';
  std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::~unique_ptr(&local_98);
  return;
}

Assistant:

void HL1MDLLoader::load_file_into_buffer(const std::string &file_path, unsigned char *&buffer) {
    if (!io_->Exists(file_path))
        throw DeadlyImportError("Missing file " + DefaultIOSystem::fileName(file_path) + ".");

    std::unique_ptr<IOStream> file(io_->Open(file_path));

    if (file.get() == NULL)
        throw DeadlyImportError("Failed to open MDL file " + DefaultIOSystem::fileName(file_path) + ".");

    const size_t file_size = file->FileSize();
    if (file_size < sizeof(MDLFileHeader))
        throw DeadlyImportError("MDL file is too small.");

    buffer = new unsigned char[1 + file_size];
    file->Read((void *)buffer, 1, file_size);
    buffer[file_size] = '\0';
}